

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O2

ChVector<double> *
chrono::fea::rotutils::VecRot(ChVector<double> *__return_storage_ptr__,ChMatrix33<double> *Phi)

{
  Scalar *pSVar1;
  ulong row;
  double dVar2;
  Scalar SVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double local_f8;
  double local_f0;
  double local_e8;
  ChMatrix33<double> eet;
  ChStarMatrix33<double> unitx;
  double a;
  ChMatrix33<double> *local_40;
  double local_30;
  
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  dVar4 = ((Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] +
           (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] +
           (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] +
          -1.0) * 0.5;
  if (dVar4 <= 0.0) {
    local_30 = 0.5;
    a = (double)Phi;
    local_40 = Phi;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                      *)&unitx,&local_30,(StorageBaseType *)&a);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&eet,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>_>
                *)&unitx);
    eet.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         eet.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
         dVar4;
    eet.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         eet.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
         dVar4;
    dVar2 = eet.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] -
            dVar4;
    if (eet.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] <=
        eet.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]) {
      local_f0 = eet.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
      local_f8 = eet.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
      local_e8 = eet.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
    }
    else {
      local_e8 = eet.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
      local_f8 = eet.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
      local_f0 = eet.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    }
    row = (ulong)(eet.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4] >
                 eet.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0]);
    eet.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = dVar2;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)&eet,row,row);
    if (*pSVar1 < dVar2) {
      local_e8 = eet.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
      local_f0 = eet.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
      row = 2;
      local_f8 = eet.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
    }
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)&eet,row,row);
    dVar2 = (1.0 - dVar4) * *pSVar1;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar2;
      auVar5 = vsqrtsd_avx(auVar5,auVar5);
      dVar2 = auVar5._0_8_;
    }
    dVar2 = 1.0 / dVar2;
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         dVar2 * local_f8;
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         dVar2 * local_f0;
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         dVar2 * local_e8;
    auVar8._0_8_ = -unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[3];
    auVar8._8_8_ = 0x8000000000000000;
    __return_storage_ptr__->m_data[0] =
         unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    __return_storage_ptr__->m_data[1] =
         unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    __return_storage_ptr__->m_data[2] =
         unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)vmovlpd_avx(auVar8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar5 = vunpcklpd_avx(auVar6,auVar7);
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         -auVar5._0_8_;
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         -auVar5._8_8_;
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
    a = (double)&unitx;
    local_40 = Phi;
    SVar3 = Eigen::
            MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
            ::trace((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                     *)&a);
    dVar4 = atan2(SVar3 * -0.5,dVar4);
    ChVector<double>::operator*=(__return_storage_ptr__,dVar4);
  }
  else {
    ChMatrix33<double>::GetAx(Phi);
    if (&eet != (ChMatrix33<double> *)__return_storage_ptr__) {
      __return_storage_ptr__->m_data[0] =
           eet.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      __return_storage_ptr__->m_data[1] =
           eet.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      __return_storage_ptr__->m_data[2] =
           eet.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    }
    dVar2 = ChVector<double>::Length(__return_storage_ptr__);
    eet.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         atan2(dVar2,dVar4);
    eet.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    eet.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    unitx.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         eet.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    CoeffA<chrono::ChVector<double>,double>((ChVector<double> *)&eet,(ChVector<double> *)&unitx,&a);
    ChVector<double>::operator/=(__return_storage_ptr__,a);
  }
  return __return_storage_ptr__;
}

Assistant:

ChVector<> VecRot(const ChMatrix33<>& Phi) {
    double a, cosphi, sinphi;
    ChVector<> unit;

    cosphi = (Phi.trace() - 1.) / 2.;
    if (cosphi > 0.) {
        unit = Phi.GetAx();
        sinphi = unit.Length();
        double phi = atan2(sinphi, cosphi);
        CoeffA(ChVector<>(phi, 0., 0.), ChVector<>(phi, 0., 0.), &a);
        unit /= a;
    } else {
        // -1 <= cosphi <= 0
        ChMatrix33<> eet = 0.5 * (Phi + Phi.transpose());
        eet(0, 0) -= cosphi;
        eet(1, 1) -= cosphi;
        eet(2, 2) -= cosphi;
        int maxcol = 0;
        ChVector<> col = eet.Get_A_Xaxis();
        if (eet(1, 1) > eet(0, 0)) {
            maxcol = 1;
            col = eet.Get_A_Yaxis();
        }
        if (eet(2, 2) > eet(maxcol, maxcol)) {
            maxcol = 2;
            col = eet.Get_A_Zaxis();
        }
        unit = (col / sqrt(eet(maxcol, maxcol) * (1. - cosphi)));
        ChStarMatrix33<> unitx(unit);
        sinphi = -(unitx * Phi).trace() / 2.;
        unit *= atan2(sinphi, cosphi);
    }
    return unit;
}